

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O0

int Min_SopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  int iVar1;
  Min_Cube_t *local_50;
  Min_Cube_t *local_48;
  uint local_3c;
  Min_Cube_t *pMStack_38;
  int i;
  Min_Cube_t **ppPrev;
  Min_Cube_t *pThis2;
  Min_Cube_t *pThis;
  Min_Cube_t *pCube_local;
  Min_Man_t *p_local;
  
  for (pThis2 = p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16]; pThis2 != (Min_Cube_t *)0x0;
      pThis2 = pThis2->pNext) {
    iVar1 = Min_CubesAreEqual(pCube,pThis2);
    if (iVar1 != 0) {
      Min_CubeRecycle(p,pCube);
      return 0;
    }
  }
  local_3c = 0;
  do {
    if ((int)(*(uint *)&pCube->field_0x8 >> 0x16) <= (int)local_3c) {
      pThis2 = p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16];
      pMStack_38 = (Min_Cube_t *)(p->ppStore + (*(uint *)&pCube->field_0x8 >> 0x16));
      while( true ) {
        if (pThis2 == (Min_Cube_t *)0x0) {
          local_3c = *(uint *)&pCube->field_0x8 >> 0x16;
          while (local_3c = local_3c + 1, (int)local_3c <= (int)(*(uint *)&pCube->field_0x8 & 0x3ff)
                ) {
            pMStack_38 = (Min_Cube_t *)(p->ppStore + (int)local_3c);
            pThis2 = p->ppStore[(int)local_3c];
            if (pThis2 == (Min_Cube_t *)0x0) {
              local_48 = (Min_Cube_t *)0x0;
            }
            else {
              local_48 = pThis2->pNext;
            }
            ppPrev = &local_48->pNext;
            while (pThis2 != (Min_Cube_t *)0x0) {
              if ((pThis2 == p->pBubble) || (iVar1 = Min_CubeIsContained(pCube,pThis2), iVar1 == 0))
              {
                pMStack_38 = pThis2;
              }
              else {
                pMStack_38->pNext = pThis2->pNext;
                Min_CubeRecycle(p,pThis2);
                p->nCubes = p->nCubes + -1;
              }
              pThis2 = (Min_Cube_t *)ppPrev;
              if (ppPrev == (Min_Cube_t **)0x0) {
                local_50 = (Min_Cube_t *)0x0;
              }
              else {
                local_50 = *ppPrev;
              }
              ppPrev = &local_50->pNext;
            }
          }
          pCube->pNext = p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16];
          p->ppStore[*(uint *)&pCube->field_0x8 >> 0x16] = pCube;
          p->nCubes = p->nCubes + 1;
          return 0;
        }
        iVar1 = Min_CubesDistOne(pCube,pThis2,(Min_Cube_t *)0x0);
        if (iVar1 != 0) break;
        pMStack_38 = pThis2;
        pThis2 = pThis2->pNext;
      }
      pMStack_38->pNext = pThis2->pNext;
      Min_CubesTransformOr(pCube,pThis2);
      *(uint *)&pCube->field_0x8 =
           *(uint *)&pCube->field_0x8 & 0x3fffff |
           ((*(uint *)&pCube->field_0x8 >> 0x16) - 1) * 0x400000;
      Min_CubeRecycle(p,pThis2);
      p->nCubes = p->nCubes + -1;
      return 1;
    }
    for (pThis2 = p->ppStore[(int)local_3c]; pThis2 != (Min_Cube_t *)0x0; pThis2 = pThis2->pNext) {
      if ((pThis2 != p->pBubble) && (iVar1 = Min_CubeIsContained(pThis2,pCube), iVar1 != 0)) {
        Min_CubeRecycle(p,pCube);
        return 0;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int Min_SopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, * pThis2, ** ppPrev;
    int i;
    // try to find the identical cube
    Min_CoverForEachCube( p->ppStore[pCube->nLits], pThis )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find a containing cube
    for ( i = 0; i < (int)pCube->nLits; i++ )
    Min_CoverForEachCube( p->ppStore[i], pThis )
    {
        if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find distance one in the same bin
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, NULL ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransformOr( pCube, pThis );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }

    // clean the other cubes using this one
    for ( i = pCube->nLits + 1; i <= (int)pCube->nVars; i++ )
    {
        ppPrev = &p->ppStore[i];
        Min_CoverForEachCubeSafe( p->ppStore[i], pThis, pThis2 )
        {
            if ( pThis != p->pBubble && Min_CubeIsContained( pCube, pThis ) )
            {
                *ppPrev = pThis->pNext;
                Min_CubeRecycle( p, pThis );
                p->nCubes--;
            }
            else
                ppPrev = &pThis->pNext;
        }
    }

    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}